

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boards.cpp
# Opt level: O2

pair<int,_int> __thiscall Boards::Count(Boards *this)

{
  int iVar1;
  int i;
  long lVar2;
  pair<int,_int> pVar3;
  int iVar4;
  int iVar5;
  int j;
  long lVar6;
  array<std::array<int,_16UL>,_16UL> *paVar7;
  
  paVar7 = &this->board;
  iVar4 = 0;
  iVar5 = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      iVar1 = paVar7->_M_elems[0]._M_elems[lVar6];
      if (iVar1 == -1) {
        iVar4 = iVar4 + 1;
      }
      else if (iVar1 == 1) {
        iVar5 = iVar5 + 1;
      }
    }
    paVar7 = (array<std::array<int,_16UL>,_16UL> *)(paVar7->_M_elems + 1);
  }
  pVar3.second = iVar4;
  pVar3.first = iVar5;
  return pVar3;
}

Assistant:

std::pair<int, int> Boards::Count(){
	int b = 0, w = 0;
	for(int i = 0; i < 16; i++){
		for(int j = 0; j < 16; j++){
			if(board[i][j] == 1)w++;
			else if(board[i][j] == -1)b++;
		}
	}
	return std::pair<int, int>(w, b);
}